

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Stop_Freeze_R_PDU::Encode(Stop_Freeze_R_PDU *this)

{
  KDataStream *in_RSI;
  
  Encode((Stop_Freeze_R_PDU *)
         &this[-1].super_Stop_Freeze_PDU.super_Simulation_Management_Header.super_Header.
          super_Header6.m_TimeStamp,in_RSI);
  return;
}

Assistant:

void Stop_Freeze_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << KDIS_STREAM m_RealWorldTime
           << m_ui8Reason
           << m_ui8FrozenBehaviour
           << m_ui8ReqRelSrv
           << m_ui8Padding2
           << m_ui32RequestID;
}